

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

ZSTD_CCtx_params *
ZSTDMT_initJobCCtxParams(ZSTD_CCtx_params *__return_storage_ptr__,ZSTD_CCtx_params *params)

{
  ZSTD_CCtx_params *jobParams;
  ZSTD_CCtx_params *params_local;
  
  memcpy(__return_storage_ptr__,params,0x90);
  __return_storage_ptr__->forceWindow = 0;
  __return_storage_ptr__->nbWorkers = 0;
  __return_storage_ptr__->jobSize = 0;
  __return_storage_ptr__->overlapLog = 0;
  __return_storage_ptr__->rsyncable = 0;
  memset(&__return_storage_ptr__->ldmParams,0,0x18);
  memset(&__return_storage_ptr__->customMem,0,0x18);
  return __return_storage_ptr__;
}

Assistant:

static ZSTD_CCtx_params ZSTDMT_initJobCCtxParams(const ZSTD_CCtx_params* params)
{
    ZSTD_CCtx_params jobParams = *params;
    /* Clear parameters related to multithreading */
    jobParams.forceWindow = 0;
    jobParams.nbWorkers = 0;
    jobParams.jobSize = 0;
    jobParams.overlapLog = 0;
    jobParams.rsyncable = 0;
    memset(&jobParams.ldmParams, 0, sizeof(ldmParams_t));
    memset(&jobParams.customMem, 0, sizeof(ZSTD_customMem));
    return jobParams;
}